

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O3

void __thiscall Socket_TCP_Test::TestBody(Socket_TCP_Test *this)

{
  int handle;
  
  handle = socketsys::UnixProvider::init((UnixProvider *)0x0,(EVP_PKEY_CTX *)0x0);
  socketsys::UnixProvider::setTcpNoDelay(handle,true);
  socketsys::UnixProvider::setSoReuseAddress(handle,false);
  socketsys::UnixProvider::setSoLinger(handle,false,0);
  socketsys::UnixProvider::setSoReceiveTimeout(handle,100);
  socketsys::UnixProvider::setSoSendTimeout(handle,100);
  socketsys::UnixProvider::setSoSendBufferSize(handle,100);
  socketsys::UnixProvider::setSoReceiveBufferSize(handle,100);
  socketsys::UnixProvider::setSoKeepAlive(handle,true);
  socketsys::UnixProvider::destroy(handle);
  return;
}

Assistant:

TEST(Socket, TCP) {
    Socket socket(AddressFamily::IPV4, SocketProtocol::TCP);
    socket.setTcpNoDelay(true);
    socket.setSoReuseAddress(false);
    socket.setSoLinger(false, 0);
    socket.setSoReceiveTimeout(100);
    socket.setSoSendTimeout(100);
    socket.setSoSendBufferSize(100);
    socket.setSoReceiveBufferSize(100);
    socket.setSoKeepAlive(true);
}